

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawListSplitter::SetCurrentChannel(ImDrawListSplitter *this,ImDrawList *draw_list,int idx)

{
  ImDrawChannel *pIVar1;
  ImVector<unsigned_short> *pIVar2;
  ImDrawCmd *pIVar3;
  ImDrawCmd *pIVar4;
  unsigned_short *puVar5;
  undefined8 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  int iVar11;
  ImDrawCmd *__s1;
  
  if ((idx < 0) || (this->_Count <= idx)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x60b,"SetCurrentChannel","ImGui ASSERT FAILED: %s","idx >= 0 && idx < _Count");
  }
  if (this->_Current != idx) {
    iVar11 = (draw_list->CmdBuffer).Capacity;
    pIVar4 = (draw_list->CmdBuffer).Data;
    pIVar1 = (this->_Channels).Data + this->_Current;
    (pIVar1->_CmdBuffer).Size = (draw_list->CmdBuffer).Size;
    (pIVar1->_CmdBuffer).Capacity = iVar11;
    (pIVar1->_CmdBuffer).Data = pIVar4;
    iVar11 = (draw_list->IdxBuffer).Capacity;
    puVar5 = (draw_list->IdxBuffer).Data;
    pIVar2 = &(this->_Channels).Data[this->_Current]._IdxBuffer;
    pIVar2->Size = (draw_list->IdxBuffer).Size;
    pIVar2->Capacity = iVar11;
    pIVar2->Data = puVar5;
    this->_Current = idx;
    pIVar1 = (this->_Channels).Data + idx;
    iVar11 = (pIVar1->_CmdBuffer).Capacity;
    pIVar4 = (pIVar1->_CmdBuffer).Data;
    (draw_list->CmdBuffer).Size = (pIVar1->_CmdBuffer).Size;
    (draw_list->CmdBuffer).Capacity = iVar11;
    (draw_list->CmdBuffer).Data = pIVar4;
    pIVar2 = &(this->_Channels).Data[idx]._IdxBuffer;
    iVar11 = pIVar2->Capacity;
    puVar5 = pIVar2->Data;
    (draw_list->IdxBuffer).Size = pIVar2->Size;
    (draw_list->IdxBuffer).Capacity = iVar11;
    (draw_list->IdxBuffer).Data = puVar5;
    draw_list->_IdxWritePtr = (draw_list->IdxBuffer).Data + (draw_list->IdxBuffer).Size;
    pIVar3 = (draw_list->CmdBuffer).Data;
    iVar11 = (draw_list->CmdBuffer).Size;
    __s1 = pIVar3 + (long)iVar11 + -1;
    pIVar4 = &draw_list->_CmdHeader;
    if (pIVar3[(long)iVar11 + -1].ElemCount == 0) {
      fVar7 = (pIVar4->ClipRect).x;
      fVar8 = (pIVar4->ClipRect).y;
      fVar9 = (draw_list->_CmdHeader).ClipRect.z;
      fVar10 = (draw_list->_CmdHeader).ClipRect.w;
      uVar6 = *(undefined8 *)((long)&(draw_list->_CmdHeader).TextureId + 4);
      *(undefined8 *)&pIVar3[(long)iVar11 + -1].ClipRect.w =
           *(undefined8 *)&(draw_list->_CmdHeader).ClipRect.w;
      *(undefined8 *)((long)&pIVar3[(long)iVar11 + -1].TextureId + 4) = uVar6;
      (__s1->ClipRect).x = fVar7;
      (__s1->ClipRect).y = fVar8;
      pIVar3[(long)iVar11 + -1].ClipRect.z = fVar9;
      pIVar3[(long)iVar11 + -1].ClipRect.w = fVar10;
    }
    else {
      iVar11 = bcmp(__s1,pIVar4,0x1c);
      if (iVar11 != 0) {
        ImDrawList::AddDrawCmd(draw_list);
        return;
      }
    }
  }
  return;
}

Assistant:

void ImDrawListSplitter::SetCurrentChannel(ImDrawList* draw_list, int idx)
{
    IM_ASSERT(idx >= 0 && idx < _Count);
    if (_Current == idx)
        return;

    // Overwrite ImVector (12/16 bytes), four times. This is merely a silly optimization instead of doing .swap()
    memcpy(&_Channels.Data[_Current]._CmdBuffer, &draw_list->CmdBuffer, sizeof(draw_list->CmdBuffer));
    memcpy(&_Channels.Data[_Current]._IdxBuffer, &draw_list->IdxBuffer, sizeof(draw_list->IdxBuffer));
    _Current = idx;
    memcpy(&draw_list->CmdBuffer, &_Channels.Data[idx]._CmdBuffer, sizeof(draw_list->CmdBuffer));
    memcpy(&draw_list->IdxBuffer, &_Channels.Data[idx]._IdxBuffer, sizeof(draw_list->IdxBuffer));
    draw_list->_IdxWritePtr = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size;

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();
}